

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavMoveRequestForward
               (ImGuiDir move_dir,ImGuiDir clip_dir,ImRect *bb_rel,ImGuiNavMoveFlags move_flags)

{
  ImGuiContext *pIVar1;
  ImRect *pIVar2;
  ImGuiNavMoveFlags in_ECX;
  ImVec2 *in_RDX;
  ImGuiDir in_ESI;
  ImGuiDir in_EDI;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  if (GImGui->NavMoveRequestForward == ImGuiNavForward_None) {
    NavMoveRequestCancel();
    pIVar1->NavMoveDir = in_EDI;
    pIVar1->NavMoveClipDir = in_ESI;
    pIVar1->NavMoveRequestForward = ImGuiNavForward_ForwardQueued;
    pIVar1->NavMoveRequestFlags = in_ECX;
    pIVar2 = pIVar1->NavWindow->NavRectRel + pIVar1->NavLayer;
    pIVar2->Min = *in_RDX;
    pIVar2->Max = in_RDX[1];
    return;
  }
  __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_None",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                ,0x2068,
                "void ImGui::NavMoveRequestForward(ImGuiDir, ImGuiDir, const ImRect &, ImGuiNavMoveFlags)"
               );
}

Assistant:

void ImGui::NavMoveRequestForward(ImGuiDir move_dir, ImGuiDir clip_dir, const ImRect& bb_rel, ImGuiNavMoveFlags move_flags)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavMoveRequestForward == ImGuiNavForward_None);
    NavMoveRequestCancel();
    g.NavMoveDir = move_dir;
    g.NavMoveClipDir = clip_dir;
    g.NavMoveRequestForward = ImGuiNavForward_ForwardQueued;
    g.NavMoveRequestFlags = move_flags;
    g.NavWindow->NavRectRel[g.NavLayer] = bb_rel;
}